

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

void __thiscall apngasm::APNGAsm::dirtyTransparencyOptimization(APNGAsm *this,uchar coltype)

{
  pointer pAVar1;
  uchar *puVar2;
  size_t n;
  ulong uVar3;
  long lVar4;
  int iVar5;
  undefined7 in_register_00000031;
  
  iVar5 = (int)CONCAT71(in_register_00000031,coltype);
  if (iVar5 == 6) {
    for (uVar3 = 0;
        pAVar1 = (this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start,
        uVar3 < (ulong)(((long)(this->_frames).
                               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x430);
        uVar3 = uVar3 + 1) {
      puVar2 = pAVar1[uVar3]._pixels;
      for (lVar4 = 0; (uint)lVar4 < this->_size; lVar4 = lVar4 + 1) {
        if (puVar2[lVar4 * 4 + 3] == '\0') {
          puVar2[lVar4 * 4 + 2] = '\0';
          (puVar2 + lVar4 * 4)[0] = '\0';
          (puVar2 + lVar4 * 4)[1] = '\0';
        }
      }
    }
  }
  else if (iVar5 == 4) {
    for (uVar3 = 0;
        pAVar1 = (this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start,
        uVar3 < (ulong)(((long)(this->_frames).
                               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x430);
        uVar3 = uVar3 + 1) {
      puVar2 = pAVar1[uVar3]._pixels;
      for (lVar4 = 0; (uint)lVar4 < this->_size; lVar4 = lVar4 + 1) {
        if (puVar2[lVar4 * 2 + 1] == '\0') {
          puVar2[lVar4 * 2] = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void APNGAsm::dirtyTransparencyOptimization(unsigned char coltype)
  {
    if (coltype == 6)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=4)
          if (sp[3] == 0)
             sp[0] = sp[1] = sp[2] = 0;
      }
    }
    else
    if (coltype == 4)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=2)
          if (sp[1] == 0)
            sp[0] = 0;
      }
    }
  }